

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

JointIndex __thiscall
iDynTree::Model::addJointAndLink
          (Model *this,string *existingLink,string *jointName,IJointConstPtr joint,
          string *newLinkName,Link *newLink)

{
  bool bVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  JointIndex JVar5;
  IJointConstPtr in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  Link *in_stack_00000018;
  string *in_stack_00000020;
  string error_1;
  LinkIndex newAddedLink;
  string error;
  char *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [48];
  string *link1;
  Model *in_stack_fffffffffffffff8;
  
  link1 = in_RDI;
  std::__cxx11::string::string(local_58,(string *)in_RSI);
  bVar1 = isLinkNameUsed((Model *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                         in_RDI);
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_58);
  if ((bVar2 & 1) == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             addLink((Model *)error_1._0_8_,in_stack_00000020,in_stack_00000018);
    if (pbVar3 == LINK_INVALID_INDEX) {
      std::operator+(in_stack_ffffffffffffff58,pbVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("Model","addJointAndLink",pcVar4);
      JVar5 = JOINT_INVALID_INDEX;
      std::__cxx11::string::~string(local_d0);
    }
    else {
      JVar5 = addJoint(in_stack_fffffffffffffff8,link1,in_RSI,in_RDX,in_RCX);
    }
  }
  else {
    pbVar3 = &local_98;
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(pbVar3,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string((string *)&local_98);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("Model","addJointAndLink",pcVar4);
    JVar5 = JOINT_INVALID_INDEX;
    std::__cxx11::string::~string(local_78);
  }
  return JVar5;
}

Assistant:

JointIndex Model::addJointAndLink(const std::string& existingLink,
                                  const std::string& jointName, IJointConstPtr joint,
                                  const std::string& newLinkName, Link& newLink)
{
    if( !(this->isLinkNameUsed(existingLink)) )
    {
        std::string error = "a link of name " + existingLink + " is not present in the model";
        reportError("Model","addJointAndLink",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    LinkIndex newAddedLink = this->addLink(newLinkName,newLink);

    if( newAddedLink == LINK_INVALID_INDEX )
    {
        std::string error = "Error adding link of name " + newLinkName;
        reportError("Model","addJointAndLink",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    return this->addJoint(existingLink,newLinkName,
                          jointName,joint);
}